

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall wabt::WastLexer::GetToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte bVar1;
  TokenType TVar2;
  bool bVar3;
  byte *pbVar4;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  string_view name;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  Token local_70;
  
  do {
    pbVar4 = (byte *)this->cursor_;
    this->token_start_ = (char *)pbVar4;
    if (this->buffer_end_ <= pbVar4) goto LAB_0012916b;
    bVar1 = *pbVar4;
    uVar7 = (uint)bVar1;
    switch(bVar1) {
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      ReadWhitespace(this);
      break;
    case 0x22:
      GetStringToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x24:
      GetIdToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x28:
      s._M_str = "(;";
      s._M_len = 2;
      bVar3 = MatchString(this,s);
      if (!bVar3) {
        s_02._M_str = "(@";
        s_02._M_len = 2;
        bVar3 = MatchString(this,s_02);
        if (bVar3) {
          GetIdToken(&local_70,this);
          TextToken(__return_storage_ptr__,this,LparAnn,2);
          return __return_storage_ptr__;
        }
        if (this->cursor_ < this->buffer_end_) {
          this->cursor_ = this->cursor_ + 1;
        }
        TVar2 = Lpar;
        goto LAB_0012916d;
      }
      bVar3 = ReadBlockComment(this);
LAB_001290a7:
      if (bVar3 == false) {
LAB_0012916b:
        TVar2 = Eof;
LAB_0012916d:
        BareToken(__return_storage_ptr__,this,TVar2);
        return __return_storage_ptr__;
      }
      break;
    case 0x29:
      this->cursor_ = (char *)(pbVar4 + 1);
      TVar2 = Rpar;
      goto LAB_0012916d;
    case 0x2b:
    case 0x2d:
      pbVar4 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar4;
      if (pbVar4 < this->buffer_end_) {
        bVar1 = *pbVar4;
        if (8 < bVar1 - 0x31) {
          if (bVar1 != 0x30) {
            if (bVar1 == 0x6e) goto LAB_001292c2;
            if (bVar1 == 0x69) goto LAB_001292a2;
            goto LAB_001292b2;
          }
          s_03._M_str = "0x";
          s_03._M_len = 2;
          bVar3 = MatchString(this,s_03);
          if (bVar3) {
            TVar2 = Int;
            goto LAB_001291ce;
          }
        }
        TVar2 = Int;
        goto LAB_001291de;
      }
      goto LAB_001292b2;
    case 0x30:
      s_01._M_str = "0x";
      s_01._M_len = 2;
      bVar3 = MatchString(this,s_01);
      if (bVar3) {
        TVar2 = Last_Literal;
LAB_001291ce:
        GetHexNumberToken(__return_storage_ptr__,this,TVar2);
        return __return_storage_ptr__;
      }
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      TVar2 = Last_Literal;
LAB_001291de:
      GetNumberToken(__return_storage_ptr__,this,TVar2);
      return __return_storage_ptr__;
    case 0x3b:
      s_00._M_str = ";;";
      s_00._M_len = 2;
      bVar3 = MatchString(this,s_00);
      if (bVar3) {
        bVar3 = ReadLineComment(this);
        goto LAB_001290a7;
      }
      if (this->cursor_ < this->buffer_end_) {
        this->cursor_ = this->cursor_ + 1;
      }
      GetLocation(this);
      goto LAB_00129150;
    default:
      if (bVar1 == 0x61) {
        pcVar5 = "align=";
        sVar6 = 6;
        TVar2 = AlignEqNat;
LAB_00129269:
        name._M_str = pcVar5;
        name._M_len = sVar6;
        GetNameEqNumToken(__return_storage_ptr__,this,name,TVar2);
        return __return_storage_ptr__;
      }
      if (bVar1 == 0x69) {
LAB_001292a2:
        GetInfToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      if (uVar7 == 0x6e) {
LAB_001292c2:
        GetNanToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      if (uVar7 == 0x6f) {
        pcVar5 = "offset=";
        sVar6 = 7;
        TVar2 = OffsetEqNat;
        goto LAB_00129269;
      }
    case 0xb:
    case 0xc:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x21:
    case 0x23:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x2a:
    case 0x2c:
    case 0x2e:
    case 0x2f:
    case 0x3a:
      bVar3 = IsKeyword(uVar7);
      if (bVar3) {
        GetKeywordToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      uVar7 = 0xffffffff;
      if (this->cursor_ < this->buffer_end_) {
        uVar7 = (uint)(byte)*this->cursor_;
      }
      bVar3 = IsIdChar(uVar7);
      if (bVar3) {
LAB_001292b2:
        GetReservedToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      if (this->cursor_ < this->buffer_end_) {
        this->cursor_ = this->cursor_ + 1;
      }
      GetLocation(this);
LAB_00129150:
      Error(this,0x16f9f9);
    }
  } while( true );
}

Assistant:

Token WastLexer::GetToken() {
  while (true) {
    token_start_ = cursor_;
    switch (PeekChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '(':
        if (MatchString("(;")) {
          if (ReadBlockComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else if (MatchString("(@")) {
          GetIdToken();
          // offset=2 to skip the "(@" prefix
          return TextToken(TokenType::LparAnn, 2);
        } else {
          ReadChar();
          return BareToken(TokenType::Lpar);
        }
        break;

      case ')':
        ReadChar();
        return BareToken(TokenType::Rpar);

      case ';':
        if (MatchString(";;")) {
          if (ReadLineComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
        break;

      case ' ':
      case '\t':
      case '\r':
      case '\n':
        ReadWhitespace();
        continue;

      case '"':
        return GetStringToken();

      case '+':
      case '-':
        ReadChar();
        switch (PeekChar()) {
          case 'i':
            return GetInfToken();

          case 'n':
            return GetNanToken();

          case '0':
            return MatchString("0x") ? GetHexNumberToken(TokenType::Int)
                                     : GetNumberToken(TokenType::Int);
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
            return GetNumberToken(TokenType::Int);

          default:
            return GetReservedToken();
        }
        break;

      case '0':
        return MatchString("0x") ? GetHexNumberToken(TokenType::Nat)
                                 : GetNumberToken(TokenType::Nat);

      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return GetNumberToken(TokenType::Nat);

      case '$':
        return GetIdToken();

      case 'a':
        return GetNameEqNumToken("align=", TokenType::AlignEqNat);

      case 'i':
        return GetInfToken();

      case 'n':
        return GetNanToken();

      case 'o':
        return GetNameEqNumToken("offset=", TokenType::OffsetEqNat);

      default:
        if (IsKeyword(PeekChar())) {
          return GetKeywordToken();
        } else if (IsIdChar(PeekChar())) {
          return GetReservedToken();
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
    }
  }
}